

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long mkvparser::VideoTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               VideoTrack **pResult)

{
  IMkvReader *pReader;
  longlong lVar1;
  longlong lVar2;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> uVar3;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> uVar4;
  VideoTrack **ppVVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  longlong lVar9;
  VideoTrack *this;
  long lVar10;
  longlong pos;
  longlong size;
  Projection *projection;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> projection_ptr;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  longlong local_a0;
  longlong local_98;
  longlong local_90;
  longlong local_88;
  longlong local_80;
  longlong local_78;
  double local_70;
  char *colour_space;
  double rate;
  longlong local_50;
  longlong local_48;
  VideoTrack **local_40;
  longlong id;
  
  lVar8 = -1;
  if ((*pResult == (VideoTrack *)0x0) && (info->type == 1)) {
    rate = 0.0;
    colour_space = (char *)0x0;
    pos = (info->settings).start;
    local_50 = element_start;
    local_48 = element_size;
    local_40 = pResult;
    if (pos < 0) {
      __assert_fail("s.start >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x14cf,
                    "static long mkvparser::VideoTrack::Parse(Segment *, const Info &, long long, long long, VideoTrack *&)"
                   );
    }
    lVar10 = (info->settings).size;
    if (lVar10 < 0) {
      __assert_fail("s.size >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x14d0,
                    "static long mkvparser::VideoTrack::Parse(Segment *, const Info &, long long, long long, VideoTrack *&)"
                   );
    }
    pReader = pSegment->m_pReader;
    colour_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
    super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
    super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>)
         (__uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>)0x0;
    projection_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>._M_t.
    super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>.
    super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
          )(__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>)0x0;
    lVar10 = lVar10 + pos;
    local_78 = 0;
    local_70 = 0.0;
    local_80 = 0;
    local_88 = 0;
    local_90 = 0;
    local_98 = 0;
    local_a0 = 0;
    do {
      ppVVar5 = local_40;
      if (lVar10 <= pos) {
        lVar8 = -2;
        if (pos == lVar10) {
          this = (VideoTrack *)operator_new(0x110,(nothrow_t *)&std::nothrow);
          lVar8 = -1;
          if (this != (VideoTrack *)0x0) {
            VideoTrack(this,pSegment,local_50,local_48);
            iVar7 = Track::Info::Copy(info,&(this->super_Track).m_info);
            uVar4 = colour_ptr;
            uVar3 = projection_ptr;
            if (iVar7 == 0) {
              this->m_width = local_a0;
              this->m_height = local_98;
              this->m_display_width = local_90;
              this->m_display_height = local_88;
              this->m_display_unit = local_80;
              colour_ptr._M_t.
              super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t
              .super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
              super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl =
                   (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>
                    )(__uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>)
                     0x0;
              this->m_stereo_mode = local_78;
              this->m_rate = local_70;
              this->m_colour =
                   (Colour *)
                   uVar4._M_t.
                   super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                   .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl;
              projection_ptr._M_t.
              super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
              ._M_t.
              super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
              .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl =
                   (__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
                    )(__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                      )0x0;
              this->m_colour_space = colour_space;
              this->m_projection =
                   (Projection *)
                   uVar3._M_t.
                   super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
                   .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl;
              *ppVVar5 = this;
              lVar8 = 0;
            }
            else {
              (*(this->super_Track)._vptr_Track[1])(this);
            }
          }
        }
        goto LAB_001175bc;
      }
      lVar8 = ParseElementHeader(pReader,&pos,lVar10,&id,&size);
      lVar2 = size;
      lVar1 = pos;
      if (lVar8 < 0) goto LAB_001175bc;
      if (id == 0xb0) {
        local_a0 = UnserializeUInt(pReader,pos,size);
        lVar9 = local_a0;
joined_r0x00117478:
        if (lVar9 < 1) break;
      }
      else {
        if (id == 0xba) {
          local_98 = UnserializeUInt(pReader,pos,size);
          lVar9 = local_98;
          goto joined_r0x00117478;
        }
        if (id == 0x53b8) {
          local_78 = UnserializeUInt(pReader,pos,size);
          lVar9 = local_78;
joined_r0x0011749e:
          if (lVar9 < 0) break;
        }
        else {
          if (id == 0x54b0) {
            local_90 = UnserializeUInt(pReader,pos,size);
            lVar9 = local_90;
            goto joined_r0x00117478;
          }
          if (id == 0x54b2) {
            local_80 = UnserializeUInt(pReader,pos,size);
            lVar9 = local_80;
            goto joined_r0x0011749e;
          }
          if (id == 0x54ba) {
            local_88 = UnserializeUInt(pReader,pos,size);
            lVar9 = local_88;
            goto joined_r0x00117478;
          }
          if (id == 0x55b0) {
            projection = (Projection *)0x0;
            bVar6 = Colour::Parse(pReader,pos,size,(Colour **)&projection);
            if (!bVar6) break;
            std::__uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::reset
                      ((__uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                        *)&colour_ptr,(pointer)projection);
          }
          else if (id == 0x7670) {
            projection = (Projection *)0x0;
            bVar6 = Projection::Parse(pReader,pos,size,&projection);
            if (!bVar6) break;
            std::__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
            ::reset((__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                     *)&projection_ptr,projection);
          }
          else if (id == 0x2383e3) {
            lVar8 = UnserializeFloat(pReader,pos,size,&rate);
            if (lVar8 < 0) goto LAB_001175bc;
            local_70 = rate;
            if (rate <= 0.0) break;
          }
          else if ((id == 0x2eb524) &&
                  (lVar8 = UnserializeString(pReader,pos,size,&colour_space), lVar8 < 0))
          goto LAB_001175bc;
        }
      }
      pos = lVar1 + lVar2;
    } while (pos <= lVar10);
    lVar8 = -2;
LAB_001175bc:
    std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::~unique_ptr
              (&projection_ptr);
    std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::~unique_ptr
              (&colour_ptr);
  }
  return lVar8;
}

Assistant:

long VideoTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       VideoTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kVideo)
    return -1;

  long long width = 0;
  long long height = 0;
  long long display_width = 0;
  long long display_height = 0;
  long long display_unit = 0;
  long long stereo_mode = 0;

  double rate = 0.0;
  char* colour_space = NULL;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  std::unique_ptr<Colour> colour_ptr;
  std::unique_ptr<Projection> projection_ptr;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvPixelWidth) {
      width = UnserializeUInt(pReader, pos, size);

      if (width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvPixelHeight) {
      height = UnserializeUInt(pReader, pos, size);

      if (height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayWidth) {
      display_width = UnserializeUInt(pReader, pos, size);

      if (display_width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayHeight) {
      display_height = UnserializeUInt(pReader, pos, size);

      if (display_height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayUnit) {
      display_unit = UnserializeUInt(pReader, pos, size);

      if (display_unit < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvStereoMode) {
      stereo_mode = UnserializeUInt(pReader, pos, size);

      if (stereo_mode < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvFrameRate) {
      const long status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvColour) {
      Colour* colour = NULL;
      if (!Colour::Parse(pReader, pos, size, &colour)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        colour_ptr.reset(colour);
      }
    } else if (id == libwebm::kMkvProjection) {
      Projection* projection = NULL;
      if (!Projection::Parse(pReader, pos, size, &projection)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        projection_ptr.reset(projection);
      }
    } else if (id == libwebm::kMkvColourSpace) {
      const long status = UnserializeString(pReader, pos, size, colour_space);
      if (status < 0)
        return status;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  VideoTrack* const pTrack =
      new (std::nothrow) VideoTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pTrack->m_width = width;
  pTrack->m_height = height;
  pTrack->m_display_width = display_width;
  pTrack->m_display_height = display_height;
  pTrack->m_display_unit = display_unit;
  pTrack->m_stereo_mode = stereo_mode;
  pTrack->m_rate = rate;
  pTrack->m_colour = colour_ptr.release();
  pTrack->m_colour_space = colour_space;
  pTrack->m_projection = projection_ptr.release();

  pResult = pTrack;
  return 0;  // success
}